

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O3

int __thiscall
RSA::decrypt_abi_cxx11_
          (RSA *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  undefined1 uVar3;
  char *pcVar4;
  char *pcVar5;
  Conversion *pCVar6;
  _Base_ptr p_Var7;
  char *pcVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  BigInt cipher;
  set<char,_std::less<char>,_std::allocator<char>_> vocab_set;
  string local_d8;
  BigInt local_b8;
  BigInt local_98;
  BigInt local_78;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_58;
  
  std::set<char,std::less<char>,std::allocator<char>>::
  set<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((set<char,std::less<char>,std::allocator<char>> *)&local_58,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )*(char **)(ctx + 8),
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(*(char **)(ctx + 8) + *(long *)(ctx + 0x10)));
  pcVar4 = *(char **)(ctx + 0x48);
  pcVar5 = *(char **)(ctx + 0x50);
  if (pcVar5 != (char *)0x0) {
    if (local_58._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00104c6e:
      std::__cxx11::string::_M_replace((ulong)(ctx + 0x48),0,pcVar5,0x10d0c3);
      *(undefined4 *)(ctx + 0x198) = 1;
      if (*(long *)(ctx + 0x188) != *(long *)(ctx + 0x180)) {
        *(long *)(ctx + 0x188) = *(long *)(ctx + 0x180);
      }
      (this->super_Crypto)._vptr_Crypto =
           (_func_int **)&(this->super_Crypto).vocabulary._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)this,"");
      goto LAB_00104cc1;
    }
    p_Var1 = &local_58._M_impl.super__Rb_tree_header;
    pcVar8 = pcVar4;
    do {
      cVar2 = *pcVar8;
      p_Var7 = local_58._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var11 = &p_Var1->_M_header;
      do {
        p_Var10 = p_Var11;
        p_Var9 = p_Var7;
        uVar3 = (undefined1)p_Var9[1]._M_color;
        p_Var11 = p_Var9;
        if ((char)uVar3 < cVar2) {
          p_Var11 = p_Var10;
        }
        p_Var7 = (&p_Var9->_M_left)[(char)uVar3 < cVar2];
      } while ((&p_Var9->_M_left)[(char)uVar3 < cVar2] != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var11 == p_Var1) goto LAB_00104c6e;
      if ((char)uVar3 < cVar2) {
        p_Var9 = p_Var10;
      }
      if (cVar2 < (char)p_Var9[1]._M_color) goto LAB_00104c6e;
      pcVar8 = pcVar8 + 1;
    } while (pcVar8 != pcVar4 + (long)pcVar5);
  }
  pCVar6 = *(Conversion **)(ctx + 0x1a0);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,pcVar4,pcVar4 + (long)pcVar5);
  Conversion::convert_to_num_base(&local_78,pCVar6,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  pCVar6 = *(Conversion **)(ctx + 0x1a0);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&local_b8.vector_value,(vector<long_long,_std::allocator<long_long>_> *)(ctx + 0x140));
  local_b8.sign = *(int *)(ctx + 0x158);
  BigInt::powMod(&local_98,&local_78,&local_b8,(BigInt *)(ctx + 0xe0));
  Conversion::convert_to_voacb_base_abi_cxx11_((string *)this,pCVar6,&local_98);
  if (local_98.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_00104cc1:
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_58);
  return (int)this;
}

Assistant:

string RSA::decrypt() {
    set<char> vocab_set(vocabulary.begin(), vocabulary.end());

    for (auto cipher_char:cipherText)
        if (vocab_set.find(cipher_char) == vocab_set.end()) {
            cipherText = "Some letter in the cipher text is not contained in vocabulary";
            cipher_BigInt = 0;
            return "";
        }
    BigInt cipher = conversion->convert_to_num_base(cipherText);

    return conversion->convert_to_voacb_base(cipher.powMod(d, n));
}